

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall
InitSocket::NotifyOnAddressChanges
          (InitSocket *this,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
          *vNewListing)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *p_Var1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  *p_Var2;
  pointer ptVar3;
  __type _Var4;
  iterator __position;
  long lVar5;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  *p_Var6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  const_iterator __position_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  *ptVar8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  vDelIPAddr;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  iter;
  
  vDelIPAddr.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vDelIPAddr.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vDelIPAddr.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::mutex::lock(&this->m_mxCurIpAddr);
  __position._M_current =
       (this->m_vCurIPAddr).
       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    p_Var6 = &((vNewListing->
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    ;
    p_Var2 = &((vNewListing->
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)->
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    ;
    if (__position._M_current ==
        (this->m_vCurIPAddr).
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (; p_Var6 != p_Var2; p_Var6 = p_Var6 + 1) {
        std::
        _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
        ::_Tuple_impl(&iter.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                      ,p_Var6);
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ::push_back(&this->m_vCurIPAddr,
                    (value_type *)
                    &iter.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                   );
        std::__cxx11::string::~string
                  ((string *)
                   &iter.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  );
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxCurIpAddr);
      ptVar3 = vDelIPAddr.
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->m_fnCbAddrNotify).super__Function_base._M_manager != (_Manager_type)0x0) {
        p_Var1 = &iter.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ;
        for (p_Var6 = &(vDelIPAddr.
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
            ; p_Var6 != &ptVar3->
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
            ; p_Var6 = p_Var6 + 1) {
          std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
          ::_Tuple_impl(&iter.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                        ,p_Var6);
          std::
          function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
          ::operator()(&this->m_fnCbAddrNotify,false,&p_Var1->_M_head_impl,
                       iter.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                       .super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl,
                       (int)iter.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                            .super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                            super__Head_base<2UL,_int,_false>._M_head_impl);
          std::__cxx11::string::~string((string *)p_Var1);
        }
        p_Var2 = &((vNewListing->
                   super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish)->
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
        ;
        p_Var1 = &iter.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ;
        for (p_Var6 = &((vNewListing->
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
            ; p_Var6 != p_Var2; p_Var6 = p_Var6 + 1) {
          std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
          ::_Tuple_impl(&iter.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                        ,p_Var6);
          std::
          function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
          ::operator()(&this->m_fnCbAddrNotify,true,&p_Var1->_M_head_impl,
                       iter.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                       .super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl,
                       (int)iter.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                            .super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                            super__Head_base<2UL,_int,_false>._M_head_impl);
          std::__cxx11::string::~string((string *)p_Var1);
        }
      }
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ::~vector(&vDelIPAddr);
      return;
    }
    p_Var1 = &((__position._M_current)->
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              ).
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ;
    lVar7 = 0;
    for (lVar5 = ((long)p_Var2 - (long)p_Var6) / 0x28 >> 2;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(p_Var6->
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        )._M_head_impl._M_dataplus._M_p + lVar7), 0 < lVar5; lVar5 = lVar5 + -1) {
      _Var4 = std::operator==(&p_Var1->_M_head_impl,__rhs);
      if (_Var4) {
        __position_00._M_current =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              *)((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)&p_Var6->super__Tuple_impl<1UL,_int,_int>)->
                        super__Tuple_impl<1UL,_int,_int>).super__Tuple_impl<2UL,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl + lVar7);
        goto LAB_001146a0;
      }
      _Var4 = std::operator==(&p_Var1->_M_head_impl,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&p_Var6[1].
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                      ._M_head_impl._M_dataplus._M_p + lVar7));
      if (_Var4) {
        __position_00._M_current =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              *)((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)&p_Var6[1].super__Tuple_impl<1UL,_int,_int>)->
                        super__Tuple_impl<1UL,_int,_int>).super__Tuple_impl<2UL,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl + lVar7);
        goto LAB_001146a0;
      }
      _Var4 = std::operator==(&p_Var1->_M_head_impl,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&p_Var6[2].
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                      ._M_head_impl._M_dataplus._M_p + lVar7));
      if (_Var4) {
        __position_00._M_current =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              *)((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)&p_Var6[2].super__Tuple_impl<1UL,_int,_int>)->
                        super__Tuple_impl<1UL,_int,_int>).super__Tuple_impl<2UL,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl + lVar7);
        goto LAB_001146a0;
      }
      _Var4 = std::operator==(&p_Var1->_M_head_impl,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&p_Var6[3].
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                      ._M_head_impl._M_dataplus._M_p + lVar7));
      if (_Var4) {
        __position_00._M_current =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              *)((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)&p_Var6[3].super__Tuple_impl<1UL,_int,_int>)->
                        super__Tuple_impl<1UL,_int,_int>).super__Tuple_impl<2UL,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl + lVar7);
        goto LAB_001146a0;
      }
      lVar7 = lVar7 + 0xa0;
    }
    lVar5 = (((long)p_Var2 - (long)p_Var6) - lVar7) / 0x28;
    ptVar8 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              *)((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)&p_Var6->super__Tuple_impl<1UL,_int,_int>)->
                        super__Tuple_impl<1UL,_int,_int>).super__Tuple_impl<2UL,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl + lVar7);
    if (lVar5 == 1) {
LAB_0011471b:
      _Var4 = std::operator==(&p_Var1->_M_head_impl,
                              &(ptVar8->
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                               ).
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl);
      __position_00._M_current = ptVar8;
      if (!_Var4) {
        __position_00._M_current =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              *)p_Var2;
      }
    }
    else if (lVar5 == 3) {
      _Var4 = std::operator==(&p_Var1->_M_head_impl,__rhs);
      __position_00._M_current = ptVar8;
      if (!_Var4) {
        ptVar8 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  *)((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                               *)&p_Var6[1].super__Tuple_impl<1UL,_int,_int>)->
                            super__Tuple_impl<1UL,_int,_int>).super__Tuple_impl<2UL,_int>.
                            super__Head_base<2UL,_int,_false>._M_head_impl + lVar7);
        goto LAB_001146ff;
      }
    }
    else {
      __position_00._M_current =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
            *)p_Var2;
      if (lVar5 == 2) {
LAB_001146ff:
        _Var4 = std::operator==(&p_Var1->_M_head_impl,
                                &(ptVar8->
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                 ).
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 ._M_head_impl);
        __position_00._M_current = ptVar8;
        if (!_Var4) {
          ptVar8 = ptVar8 + 1;
          goto LAB_0011471b;
        }
      }
    }
LAB_001146a0:
    if (__position_00._M_current ==
        (vNewListing->
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ::push_back(&vDelIPAddr,__position._M_current);
      __position = std::
                   vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                   ::erase(&this->m_vCurIPAddr,(const_iterator)__position._M_current);
    }
    else {
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ::erase(vNewListing,__position_00);
      __position._M_current = __position._M_current + 1;
    }
  } while( true );
}

Assistant:

void InitSocket::NotifyOnAddressChanges(vector<tuple<string, int, int>>& vNewListing)
{
    vector<tuple<string, int, int>> vDelIPAddr;

    m_mxCurIpAddr.lock();
    // remove all IP addr. in the vector that where before available
    for (auto iter = begin(m_vCurIPAddr); iter != end(m_vCurIPAddr);)
    {
        auto itFound = find_if(begin(vNewListing), end(vNewListing), [iter](auto& item) { return get<0>(*iter) == get<0>(item) ? true : false; });
        if (itFound != end(vNewListing))
            vNewListing.erase(itFound);  // address existed before, so remove it from the list with our new addresses
        else
        {   // the IP does not exist any more
            vDelIPAddr.push_back(*iter);    // remember witch one was removed
            iter = m_vCurIPAddr.erase(iter);
            continue;
        }
        ++iter;
    }

    for (auto iter : vNewListing)
        m_vCurIPAddr.push_back(iter);    // remember witch one was removed

    m_mxCurIpAddr.unlock();

    if (m_fnCbAddrNotify)
    {
        // Notify on all deleted IP addresses
        for (auto iter : vDelIPAddr)
            m_fnCbAddrNotify(false, get<0>(iter), get<1>(iter), get<2>(iter));
        // Notify on all new IP addresses
        for (auto iter : vNewListing)
            m_fnCbAddrNotify(true, get<0>(iter), get<1>(iter), get<2>(iter));
    }
}